

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_load(CompilerHLSL *this,Instruction *instruction)

{
  uint result_type;
  uint32_t result_id;
  ID id_00;
  Variant *pVVar1;
  bool bVar2;
  byte bVar3;
  ExecutionModel EVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  SPIRAccessChain *chain;
  SPIRType *pSVar7;
  iterator iVar8;
  SPIRExpression *e;
  SPIRType *type;
  char **in_R8;
  uint32_t index;
  ulong uVar9;
  uint32_t id;
  string load_expr;
  uint32_t local_9c;
  string local_98;
  string local_78;
  char *local_58;
  string local_50;
  
  puVar6 = Compiler::stream((Compiler *)this,instruction);
  result_type = *puVar6;
  result_id = puVar6[1];
  id_00.id = puVar6[2];
  uVar9 = (ulong)id_00.id;
  pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr;
  local_9c = result_id;
  if ((uVar9 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1[uVar9].type == TypeAccessChain)) {
    chain = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar9);
    pSVar7 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (((pSVar7->array).super_VectorView<unsigned_int>.buffer_size != 0) ||
       (pSVar7->basetype == Struct)) {
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,result_type,result_id);
      CompilerGLSL::to_expression_abi_cxx11_(&local_98,&this->super_CompilerGLSL,result_id,true);
      read_access_chain(this,(string *)0x0,&local_98,chain);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id)
      ;
      return;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    read_access_chain(this,&local_98,&local_78,chain);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,id_00.id);
    if ((bVar2) &&
       (iVar8 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries._M_h,&local_9c)
       , iVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)) {
      bVar3 = 1;
    }
    else {
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id)
      ;
      bVar3 = 0;
    }
    bVar2 = (bool)(pSVar7->columns < 2 & bVar3);
    e = CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,local_9c,&local_98,bVar2,true);
    e->need_transpose = false;
    Compiler::register_read((Compiler *)this,local_9c,id_00.id,bVar2);
    Compiler::inherit_expression_dependencies((Compiler *)this,local_9c,id_00.id);
    if (bVar2 != false) {
      Compiler::add_implied_read_expression((Compiler *)this,e,(chain->super_IVariant).self.id);
    }
LAB_001d83d3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    return;
  }
  pSVar7 = Variant::get<spirv_cross::SPIRType>(pVVar1 + result_type);
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  if (((EVar4 == ExecutionModelMeshEXT) &&
      (bVar2 = Compiler::has_decoration((Compiler *)this,id_00,BuiltIn), bVar2)) &&
     (((uVar5 = Compiler::get_decoration((Compiler *)this,id_00,BuiltIn), uVar5 == 3 ||
       (uVar5 = Compiler::get_decoration((Compiler *)this,id_00,BuiltIn), uVar5 == 4)) &&
      (bVar2 = Compiler::is_array((Compiler *)this,pSVar7), bVar2)))) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (pSVar7->parent_type).id);
    bVar2 = Compiler::is_array((Compiler *)this,type);
    if ((!bVar2) &&
       (uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar7), 1 < uVar5)) {
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,id_00.id);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"{ ","");
      uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar7);
      if (uVar5 != 0) {
        index = 0;
        do {
          CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id_00.id,true);
          local_58 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,index);
          join<std::__cxx11::string,char_const(&)[2],char_const*>
                    (&local_78,(spirv_cross *)&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34fc6b,
                     (char (*) [2])&local_58,in_R8);
          ::std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          index = index + 1;
          if (index < uVar5) {
            ::std::__cxx11::string::append((char *)&local_98);
          }
        } while (uVar5 != index);
      }
      ::std::__cxx11::string::append((char *)&local_98);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,&local_98,false,false);
      Compiler::register_read((Compiler *)this,result_id,id_00.id,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,result_id,id_00.id);
      goto LAB_001d83d3;
    }
  }
  CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
  return;
}

Assistant:

void CompilerHLSL::emit_load(const Instruction &instruction)
{
	auto ops = stream(instruction);

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];
	uint32_t ptr = ops[2];

	auto *chain = maybe_get<SPIRAccessChain>(ptr);
	if (chain)
	{
		auto &type = get<SPIRType>(result_type);
		bool composite_load = !type.array.empty() || type.basetype == SPIRType::Struct;

		if (composite_load)
		{
			// We cannot make this work in one single expression as we might have nested structures and arrays,
			// so unroll the load to an uninitialized temporary.
			emit_uninitialized_temporary_expression(result_type, id);
			read_access_chain(nullptr, to_expression(id), *chain);
			track_expression_read(chain->self);
		}
		else
		{
			string load_expr;
			read_access_chain(&load_expr, "", *chain);

			bool forward = should_forward(ptr) && forced_temporaries.find(id) == end(forced_temporaries);

			// If we are forwarding this load,
			// don't register the read to access chain here, defer that to when we actually use the expression,
			// using the add_implied_read_expression mechanism.
			if (!forward)
				track_expression_read(chain->self);

			// Do not forward complex load sequences like matrices, structs and arrays.
			if (type.columns > 1)
				forward = false;

			auto &e = emit_op(result_type, id, load_expr, forward, true);
			e.need_transpose = false;
			register_read(id, ptr, forward);
			inherit_expression_dependencies(id, ptr);
			if (forward)
				add_implied_read_expression(e, chain->self);
		}
	}
	else
	{
		// Very special case where we cannot rely on IO lowering.
		// Mesh shader clip/cull arrays ... Cursed.
		auto &res_type = get<SPIRType>(result_type);
		if (get_execution_model() == ExecutionModelMeshEXT &&
		    has_decoration(ptr, DecorationBuiltIn) &&
		    (get_decoration(ptr, DecorationBuiltIn) == BuiltInClipDistance ||
		     get_decoration(ptr, DecorationBuiltIn) == BuiltInCullDistance) &&
		    is_array(res_type) && !is_array(get<SPIRType>(res_type.parent_type)) &&
		    to_array_size_literal(res_type) > 1)
		{
			track_expression_read(ptr);
			string load_expr = "{ ";
			uint32_t num_elements = to_array_size_literal(res_type);
			for (uint32_t i = 0; i < num_elements; i++)
			{
				load_expr += join(to_expression(ptr), ".", index_to_swizzle(i));
				if (i + 1 < num_elements)
					load_expr += ", ";
			}
			load_expr += " }";
			emit_op(result_type, id, load_expr, false);
			register_read(id, ptr, false);
			inherit_expression_dependencies(id, ptr);
		}
		else
		{
			CompilerGLSL::emit_instruction(instruction);
		}
	}
}